

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

Aig_ManPre_t * Aig_ManRegManStart(Aig_Man_t *pAig,int nPartSize)

{
  int iVar1;
  Aig_ManPre_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Flt_t *pVVar5;
  float *pfVar6;
  char *pcVar7;
  
  pAVar2 = (Aig_ManPre_t *)calloc(1,0x50);
  pAVar2->pAig = pAig;
  pVVar3 = Aig_ManSupportsRegisters(pAig);
  pAVar2->vMatrix = pVVar3;
  pAVar2->nRegsMax = nPartSize;
  pVVar3 = Vec_PtrAlloc(0x100);
  pAVar2->vParts = pVVar3;
  pVVar4 = Vec_IntAlloc(0x100);
  pAVar2->vRegs = pVVar4;
  pVVar4 = Vec_IntAlloc(0x100);
  pAVar2->vUniques = pVVar4;
  pVVar4 = Vec_IntAlloc(0x100);
  pAVar2->vFreeVars = pVVar4;
  pVVar5 = (Vec_Flt_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  pfVar6 = (float *)malloc(0x400);
  pVVar5->pArray = pfVar6;
  pAVar2->vPartCost = pVVar5;
  iVar1 = pAig->nRegs;
  pcVar7 = (char *)calloc(1,(long)iVar1);
  pAVar2->pfUsedRegs = pcVar7;
  pcVar7 = (char *)malloc((long)iVar1);
  pAVar2->pfPartVars = pcVar7;
  return pAVar2;
}

Assistant:

Aig_ManPre_t * Aig_ManRegManStart( Aig_Man_t * pAig, int nPartSize )
{
    Aig_ManPre_t * p;
    p = ABC_ALLOC( Aig_ManPre_t, 1 );
    memset( p, 0, sizeof(Aig_ManPre_t) );
    p->pAig      = pAig;
    p->vMatrix   = Aig_ManSupportsRegisters( pAig );
    p->nRegsMax  = nPartSize;
    p->vParts    = Vec_PtrAlloc(256);
    p->vRegs     = Vec_IntAlloc(256);
    p->vUniques  = Vec_IntAlloc(256);
    p->vFreeVars = Vec_IntAlloc(256);
    p->vPartCost = Vec_FltAlloc(256);
    p->pfUsedRegs = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    memset( p->pfUsedRegs, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
    p->pfPartVars  = ABC_ALLOC( char, Aig_ManRegNum(p->pAig) );
    return p;
}